

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

void sort_quests(int32 **qarr,int32 *nqfone,uint32 nfone,int32 *nquests)

{
  int iVar1;
  void *ptr;
  void *ptr_00;
  long lVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  
  ptr = __ckd_calloc__((long)*nquests,4,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                       ,0x2d1);
  iVar1 = *nquests;
  lVar5 = 1;
  lVar7 = 0;
  do {
    lVar4 = lVar5;
    if (iVar1 <= lVar7) {
      iVar6 = 0;
      for (lVar5 = 0; lVar5 < iVar1; lVar5 = lVar5 + 1) {
        if (*(int *)((long)ptr + lVar5 * 4) == 1) {
          ckd_free(qarr[lVar5]);
        }
        else {
          qarr[iVar6] = qarr[lVar5];
          nqfone[iVar6] = nqfone[lVar5];
          iVar6 = iVar6 + 1;
        }
        iVar1 = *nquests;
      }
      *nquests = iVar6;
      ckd_free(ptr);
      return;
    }
    for (; (int)lVar4 < iVar1; lVar4 = lVar4 + 1) {
      if (nqfone[lVar4] + nqfone[lVar7] == nfone) {
        ptr_00 = __ckd_calloc__((ulong)nfone,4,
                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                ,0x2d6);
        for (lVar2 = 0; lVar2 < nqfone[lVar7]; lVar2 = lVar2 + 1) {
          *(undefined4 *)((long)ptr_00 + (long)qarr[lVar7][lVar2] * 4) = 1;
        }
        for (lVar2 = 0; lVar2 < nqfone[lVar4]; lVar2 = lVar2 + 1) {
          *(undefined4 *)((long)ptr_00 + (long)qarr[lVar4][lVar2] * 4) = 1;
        }
        for (uVar3 = 0; nfone != uVar3; uVar3 = uVar3 + 1) {
          if (*(int *)((long)ptr_00 + uVar3 * 4) == 0) {
            if (nfone != (uint32)uVar3) goto LAB_001045a5;
            break;
          }
        }
        lVar2 = lVar4;
        if (nqfone[lVar4] < nqfone[lVar7]) {
          lVar2 = lVar7;
        }
        *(undefined4 *)((long)ptr + lVar2 * 4) = 1;
LAB_001045a5:
        ckd_free(ptr_00);
        iVar1 = *nquests;
      }
    }
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void   sort_quests(int32 **qarr, int32 *nqfone, uint32 nfone, int32 *nquests)
{
    int32  i, j, k;
    int32  *marker, *flag;

    marker = (int32 *) ckd_calloc(*nquests,sizeof(int32));

    for (i=0;i<*nquests;i++){
        for (j=i+1; j < *nquests; j++){
            if (nqfone[i]+nqfone[j] != nfone) continue;
            flag = (int32 *) ckd_calloc(nfone,sizeof(int32));
            for (k=0;k < nqfone[i];k++) flag[qarr[i][k]] = 1;
            for (k=0;k < nqfone[j];k++) flag[qarr[j][k]] = 1;
            for (k=0;k < nfone;k++) if (flag[k] == 0) break;
            if (k == nfone) { /* the two questions are complements */
                if (nqfone[i] > nqfone[j]) marker [i] = 1;
                else marker[j] = 1;
            }
            ckd_free((void *)flag);
        }
    }
    for (i=0,j=0;i<*nquests;i++){
        if (marker[i] == 1) {
            ckd_free((void *)qarr[i]);
            continue;
        }
        qarr[j] = qarr[i];
        nqfone[j] = nqfone[i];
        j++;
    }
    *nquests = j;
       
    ckd_free((void *) marker);
}